

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_sauf_background.h
# Opt level: O2

void __thiscall SAUF_BG<UFPC>::SecondScan(SAUF_BG<UFPC> *this)

{
  int iVar1;
  Mat1i *pMVar2;
  uint *puVar3;
  uint uVar4;
  int r;
  long lVar5;
  long lVar6;
  long lVar7;
  
  uVar4 = UFPC::Flatten();
  (this->super_Labeling2D<(Connectivity2D)8,_true>).n_labels_ = uVar4;
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_labels_;
  for (lVar5 = 0; puVar3 = UFPC::P_, lVar5 < *(int *)&pMVar2->field_0x8; lVar5 = lVar5 + 1) {
    lVar6 = **(long **)&pMVar2->field_0x48 * lVar5 + *(long *)&pMVar2->field_0x10;
    iVar1 = *(int *)&pMVar2->field_0xc;
    for (lVar7 = 0; (long)iVar1 * 4 != lVar7; lVar7 = lVar7 + 4) {
      *(uint *)(lVar6 + lVar7) = puVar3[*(uint *)(lVar6 + lVar7)];
    }
  }
  return;
}

Assistant:

void SecondScan()
    {
        n_labels_ = LabelsSolver::Flatten();

        for (int r = 0; r < img_labels_.rows; ++r) {
            unsigned * img_row_start = img_labels_.ptr<unsigned>(r);
            unsigned * const img_row_end = img_row_start + img_labels_.cols;
            for (; img_row_start != img_row_end; ++img_row_start) {
                *img_row_start = LabelsSolver::GetLabel(*img_row_start);
            }
        }
    }